

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

QSize __thiscall QSplitterHandle::sizeHint(QSplitterHandle *this)

{
  long lVar1;
  int iVar2;
  QStyle *pQVar3;
  QSize QVar4;
  long in_FS_OFFSET;
  QStyleOption opt;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QPalettePrivate *pQStack_40;
  undefined1 *local_38;
  QObject *pQStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  iVar2 = QSplitter::handleWidth(*(QSplitter **)(lVar1 + 600));
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)&local_68,0,0);
  QStyleOption::initFrom((QStyleOption *)&local_68,*(QWidget **)(lVar1 + 600));
  puStack_60 = (undefined1 *)((ulong)puStack_60 & 0xffffffff00000000);
  pQVar3 = QWidget::style(*(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
  local_70 = iVar2;
  local_6c = iVar2;
  QVar4 = (QSize)(**(code **)(*(long *)pQVar3 + 0xe8))
                           (pQVar3,5,(QStyleOption *)&local_68,&local_70,
                            *(undefined8 *)(lVar1 + 600));
  QStyleOption::~QStyleOption((QStyleOption *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize QSplitterHandle::sizeHint() const
{
    Q_D(const QSplitterHandle);
    int hw = d->s->handleWidth();
    QStyleOption opt(0);
    opt.initFrom(d->s);
    opt.state = QStyle::State_None;
    return parentWidget()->style()->sizeFromContents(QStyle::CT_Splitter, &opt, QSize(hw, hw), d->s);
}